

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms.c
# Opt level: O0

int deleteFile(char *filepath)

{
  int iVar1;
  undefined1 local_b0 [8];
  stat st;
  int fd;
  char *filepath_local;
  
  st.__glibc_reserved[2]._4_4_ = open(filepath,2);
  if (st.__glibc_reserved[2]._4_4_ < 0) {
    fprintf(_stderr,"Failed opening file.\n");
    filepath_local._4_4_ = 2;
  }
  else {
    memset(local_b0,0,0x90);
    lstat(filepath,(stat *)local_b0);
    iVar1 = writeOver(st.__glibc_reserved[2]._4_4_,(int)st.st_rdev,0x20000);
    if (iVar1 == 0) {
      close(st.__glibc_reserved[2]._4_4_);
      unlink(filepath);
      filepath_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Error overwriting file.\n");
      filepath_local._4_4_ = 3;
    }
  }
  return filepath_local._4_4_;
}

Assistant:

int deleteFile(const char *filepath) {
  int fd = open(filepath, O_RDWR);
  if (fd < 0) {
    fprintf(stderr, "Failed opening file.\n");
    return 2;
  }

  struct stat st = {};
  lstat(filepath, &st);
  if (writeOver(fd, st.st_size, BUF_SIZE)) {
    fprintf(stderr, "Error overwriting file.\n");
    return 3;
  }

  //close and delete file
  close(fd);
  unlink(filepath);
  return 0;
}